

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O2

void trompeloeil::reporter<trompeloeil::specialized>::sendOk
               (char *trompeloeil_mock_calls_done_correctly)

{
  StringRef macroName;
  StringRef capturedExpression;
  char *trompeloeil_mock_calls_done_correctly_local;
  ITransientExpression local_98;
  char **local_88;
  char *local_80;
  undefined8 local_78;
  undefined4 local_70;
  AssertionHandler catchAssertionHandler;
  
  local_98._vptr_ITransientExpression = (_func_int **)0x305b52;
  local_98.m_isBinaryExpression = true;
  local_98.m_result = false;
  local_98._10_6_ = 0;
  macroName.m_size = 7;
  macroName.m_start = "REQUIRE";
  capturedExpression.m_size = 0x2a;
  capturedExpression.m_start = "trompeloeil_mock_calls_done_correctly != 0";
  trompeloeil_mock_calls_done_correctly_local = trompeloeil_mock_calls_done_correctly;
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName,(SourceLineInfo *)&local_98,capturedExpression,Normal)
  ;
  local_98.m_result = trompeloeil_mock_calls_done_correctly != (char *)0x0;
  local_98.m_isBinaryExpression = true;
  local_98._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_003cd158;
  local_80 = "!=";
  local_78 = 2;
  local_70 = 0;
  local_88 = &trompeloeil_mock_calls_done_correctly_local;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_98);
  Catch::ITransientExpression::~ITransientExpression(&local_98);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  return;
}

Assistant:

inline void reporter<specialized>::sendOk(
    const char* trompeloeil_mock_calls_done_correctly)
  {      
#ifdef CATCH_CONFIG_PREFIX_ALL
      CATCH_REQUIRE(trompeloeil_mock_calls_done_correctly != 0);
#else
      REQUIRE(trompeloeil_mock_calls_done_correctly != 0);
#endif
  }